

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_LoadZNodes(FileReader *dalump,DWORD id)

{
  int glnodes;
  FileReaderZ data;
  FileReaderZ FStack_1098;
  
  if ((int)id < 0x444f4e58) {
    if ((int)id < 0x334c4758) {
      if (id == 0x324c4758) {
        glnodes = 2;
LAB_00446a77:
        LoadZNodes(&dalump->super_FileReaderBase,glnodes);
        return;
      }
      if (id != 0x324c475a) {
        return;
      }
      glnodes = 2;
    }
    else {
      if (id == 0x334c4758) {
        glnodes = 3;
        goto LAB_00446a77;
      }
      if (id != 0x334c475a) {
        return;
      }
      glnodes = 3;
    }
  }
  else if ((int)id < 0x4e4c4758) {
    glnodes = 0;
    if (id == 0x444f4e58) goto LAB_00446a77;
    if (id != 0x444f4e5a) {
      return;
    }
  }
  else {
    if (id == 0x4e4c4758) {
      glnodes = 1;
      goto LAB_00446a77;
    }
    if (id != 0x4e4c475a) {
      return;
    }
    glnodes = 1;
  }
  FileReaderZ::FileReaderZ(&FStack_1098,dalump,false);
  LoadZNodes(&FStack_1098.super_FileReaderBase,glnodes);
  FileReaderZ::~FileReaderZ(&FStack_1098);
  return;
}

Assistant:

void P_LoadZNodes (FileReader &dalump, DWORD id)
{
	int type;
	bool compressed;

	switch (id)
	{
	case MAKE_ID('Z','N','O','D'):
		type = 0;
		compressed = true;
		break;

	case MAKE_ID('Z','G','L','N'):
		type = 1;
		compressed = true;
		break;

	case MAKE_ID('Z','G','L','2'):
		type = 2;
		compressed = true;
		break;

	case MAKE_ID('Z','G','L','3'):
		type = 3;
		compressed = true;
		break;

	case MAKE_ID('X','N','O','D'):
		type = 0;
		compressed = false;
		break;

	case MAKE_ID('X','G','L','N'):
		type = 1;
		compressed = false;
		break;

	case MAKE_ID('X','G','L','2'):
		type = 2;
		compressed = false;
		break;

	case MAKE_ID('X','G','L','3'):
		type = 3;
		compressed = false;
		break;

	default:
		return;
	}
	
	if (compressed)
	{
		FileReaderZ data (dalump);
		LoadZNodes(data, type);
	}
	else
	{
		LoadZNodes(dalump, type);
	}
}